

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall
QGraphicsScenePrivate::ungrabMouse(QGraphicsScenePrivate *this,QGraphicsItem *item,bool itemIsDying)

{
  QList<QGraphicsItem_*> *vector;
  QGraphicsItem **ppQVar1;
  long lVar2;
  QGraphicsWidget *widget;
  qsizetype qVar3;
  QGraphicsItem *pQVar4;
  long in_FS_OFFSET;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 local_44;
  char *local_40;
  QGraphicsItem *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  vector = &this->mouseGrabberItems;
  local_30 = item;
  qVar3 = QtPrivate::indexOf<QGraphicsItem*,QGraphicsItem*>(vector,&local_30,0);
  if ((int)qVar3 == -1) {
    local_58 = 2;
    local_44 = 0;
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    uStack_48 = 0;
    local_40 = "default";
    QMessageLogger::warning((char *)&local_58,"QGraphicsItem::ungrabMouse: not a mouse grabber");
  }
  else {
    ppQVar1 = (this->mouseGrabberItems).d.ptr;
    if (local_30 != ppQVar1[(this->mouseGrabberItems).d.size + -1]) {
      ungrabMouse(this,*(QGraphicsItem **)((long)ppQVar1 + ((qVar3 << 0x20) + 0x100000000 >> 0x1d)),
                  itemIsDying);
    }
    lVar2 = (this->popupWidgets).d.size;
    if (lVar2 != 0) {
      widget = (this->popupWidgets).d.ptr[lVar2 + -1];
      pQVar4 = &(widget->super_QGraphicsObject).super_QGraphicsItem;
      if (widget == (QGraphicsWidget *)0x0) {
        pQVar4 = (QGraphicsItem *)0x0;
      }
      if (local_30 == pQVar4) {
        removePopup(this,widget,itemIsDying);
        goto LAB_00593c60;
      }
    }
    if (itemIsDying) {
      QList<QGraphicsItem_*>::takeLast(vector);
      this->field_0xb9 = this->field_0xb9 & 0xf7;
    }
    else {
      local_58 = 0xaaaaaaaa;
      uStack_54 = 0xaaaaaaaa;
      uStack_50 = 0xaaaaaaaa;
      uStack_4c = 0xaaaaaaaa;
      QEvent::QEvent((QEvent *)&local_58,UngrabMouse);
      sendEvent(this,local_30,(QEvent *)&local_58);
      QEvent::~QEvent((QEvent *)&local_58);
      QList<QGraphicsItem_*>::takeLast(vector);
      this->field_0xb9 = this->field_0xb9 & 0xf7;
      lVar2 = (this->mouseGrabberItems).d.size;
      if (lVar2 != 0) {
        pQVar4 = (this->mouseGrabberItems).d.ptr[lVar2 + -1];
        local_58 = 0xaaaaaaaa;
        uStack_54 = 0xaaaaaaaa;
        uStack_50 = 0xaaaaaaaa;
        uStack_4c = 0xaaaaaaaa;
        QEvent::QEvent((QEvent *)&local_58,GrabMouse);
        sendEvent(this,pQVar4,(QEvent *)&local_58);
        QEvent::~QEvent((QEvent *)&local_58);
      }
    }
  }
LAB_00593c60:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::ungrabMouse(QGraphicsItem *item, bool itemIsDying)
{
    int index = mouseGrabberItems.indexOf(item);
    if (index == -1) {
        qWarning("QGraphicsItem::ungrabMouse: not a mouse grabber");
        return;
    }

    if (item != mouseGrabberItems.constLast()) {
        // Recursively ungrab the next mouse grabber until we reach this item
        // to ensure state consistency.
        ungrabMouse(mouseGrabberItems.at(index + 1), itemIsDying);
    }
    if (!popupWidgets.isEmpty() && item == popupWidgets.constLast()) {
        // If the item is a popup, go via removePopup to ensure state
        // consistency and that it gets hidden correctly - beware that
        // removePopup() reenters this function to continue removing the grab.
        removePopup(popupWidgets.constLast(), itemIsDying);
        return;
    }

    // Send notification about mouse ungrab.
    if (!itemIsDying) {
        QEvent event(QEvent::UngrabMouse);
        sendEvent(item, &event);
    }

    // Remove the item from the list of grabbers. Whenever this happens, we
    // reset the implicitGrab (there can be only ever be one implicit grabber
    // in a scene, and it is always the latest grabber; if the implicit grab
    // is lost, it is not automatically regained.
    mouseGrabberItems.takeLast();
    lastMouseGrabberItemHasImplicitMouseGrab = false;

    // Send notification about mouse regrab. ### It's unfortunate that all the
    // items get a GrabMouse event, but this is a rare case with a simple
    // implementation and it does ensure a consistent state.
    if (!itemIsDying && !mouseGrabberItems.isEmpty()) {
        QGraphicsItem *last = mouseGrabberItems.constLast();
        QEvent event(QEvent::GrabMouse);
        sendEvent(last, &event);
    }
}